

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compression.cpp
# Opt level: O0

void __thiscall pixels::fillPattern1(pixels *this)

{
  uint uVar1;
  uint16_t uVar2;
  uint uVar3;
  reference pvVar4;
  reference pvVar5;
  reference pvVar6;
  int *in_RDI;
  int c;
  size_t idx;
  int x;
  int y;
  float in_stack_ffffffffffffffbc;
  undefined2 in_stack_ffffffffffffffc0;
  value_type in_stack_ffffffffffffffc2;
  int local_20;
  half local_1a;
  size_type local_18;
  int local_10;
  int local_c;
  
  for (local_c = 0; local_c < in_RDI[1]; local_c = local_c + 1) {
    for (local_10 = 0; local_10 < *in_RDI; local_10 = local_10 + 1) {
      local_18 = (size_type)(local_c * in_RDI[2] + local_10);
      uVar3 = local_10 + local_c & 1;
      pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 4),
                          local_18);
      *pvVar4 = uVar3;
      pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 4),
                          local_18);
      uVar1 = *pvVar4;
      pvVar5 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)(in_RDI + 10),local_18);
      *pvVar5 = (float)uVar1;
      std::vector<float,_std::allocator<float>_>::operator[]
                ((vector<float,_std::allocator<float>_> *)(in_RDI + 10),local_18);
      Imath_3_2::half::half
                ((half *)CONCAT44(uVar3,CONCAT22(in_stack_ffffffffffffffc2,in_stack_ffffffffffffffc0
                                                )),in_stack_ffffffffffffffbc);
      uVar2 = Imath_3_2::half::bits(&local_1a);
      pvVar6 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                         ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)(in_RDI + 0x10)
                          ,local_18);
      *pvVar6 = uVar2;
      for (local_20 = 0; local_20 < 4; local_20 = local_20 + 1) {
        pvVar6 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                           ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                            (in_RDI + 0x10),local_18);
        in_stack_ffffffffffffffc2 = *pvVar6;
        pvVar6 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                           ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                            (in_RDI + (long)local_20 * 6 + 0x16),local_18);
        *pvVar6 = in_stack_ffffffffffffffc2;
      }
    }
  }
  return;
}

Assistant:

void fillPattern1 ()
    {
        for (int y = 0; y < _h; ++y)
        {
            for (int x = 0; x < _w; ++x)
            {
                size_t idx = y * _stride_x + x;
                i[idx]     = (x + y) & 1;
                f[idx]     = float (i[idx]);
                h[idx]     = half (f[idx]).bits ();
                for (int c = 0; c < 4; ++c)
                    rgba[c][idx] = h[idx];
            }
        }
    }